

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

void __thiscall
ncnn::Yolov3DetectionOutput::qsort_descent_inplace
          (Yolov3DetectionOutput *this,
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          *datas,int left,int right)

{
  float fVar1;
  pointer pBVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  pointer pBVar16;
  int iVar17;
  long lVar18;
  int right_00;
  int iVar19;
  pointer pBVar20;
  pointer pBVar21;
  long lVar22;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  do {
    right_00 = right;
    iVar19 = left;
    if (left <= right) {
      fVar1 = (datas->
              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              )._M_impl.super__Vector_impl_data._M_start[(right + left) / 2].score;
      do {
        pBVar2 = (datas->
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar18 = (long)iVar19 + -1;
        pBVar16 = pBVar2 + (long)iVar19 + -1;
        iVar17 = iVar19;
        do {
          iVar19 = iVar17;
          pBVar20 = pBVar16;
          lVar18 = lVar18 + 1;
          pBVar16 = pBVar20 + 1;
          iVar17 = iVar19 + 1;
        } while (fVar1 < pBVar20[1].score);
        lVar22 = (long)right_00 + 1;
        pBVar2 = pBVar2 + (long)right_00 + 1;
        iVar17 = right_00;
        do {
          right_00 = iVar17;
          pBVar21 = pBVar2;
          lVar22 = lVar22 + -1;
          pBVar2 = pBVar21 + -1;
          iVar17 = right_00 + -1;
        } while (pBVar21[-1].score <= fVar1 && fVar1 != pBVar21[-1].score);
        if (lVar18 <= lVar22) {
          fVar14 = pBVar16->score;
          fVar15 = pBVar16->xmin;
          uVar3 = pBVar20[1].ymin;
          uVar4 = pBVar20[1].xmax;
          uVar5 = pBVar20[1].ymax;
          fVar12 = pBVar20[1].area;
          iVar13 = pBVar20[1].label;
          fVar8 = pBVar2->score;
          fVar9 = pBVar2->xmin;
          fVar10 = pBVar21[-1].ymin;
          fVar11 = pBVar21[-1].xmax;
          fVar6 = pBVar21[-1].ymax;
          fVar7 = pBVar21[-1].area;
          iVar17 = pBVar21[-1].label;
          pBVar20[1].xmax = pBVar21[-1].xmax;
          pBVar20[1].ymax = fVar6;
          pBVar20[1].area = fVar7;
          pBVar20[1].label = iVar17;
          pBVar16->score = fVar8;
          pBVar16->xmin = fVar9;
          pBVar20[1].ymin = fVar10;
          pBVar20[1].xmax = fVar11;
          pBVar21[-1].xmax = (float)uVar4;
          pBVar21[-1].ymax = (float)uVar5;
          pBVar21[-1].area = fVar12;
          pBVar21[-1].label = iVar13;
          pBVar2->score = fVar14;
          pBVar2->xmin = fVar15;
          pBVar21[-1].ymin = (float)uVar3;
          pBVar21[-1].xmax = (float)uVar4;
          right_00 = right_00 + -1;
          iVar19 = iVar19 + 1;
        }
      } while (iVar19 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace(this,datas,left,right_00);
    }
    left = iVar19;
  } while (iVar19 < right);
  return;
}

Assistant:

void Yolov3DetectionOutput::qsort_descent_inplace(std::vector<BBoxRect>& datas, int left, int right) const
{
    int i = left;
    int j = right;
    float p = datas[(left + right) / 2].score;

    while (i <= j)
    {
        while (datas[i].score > p)
            i++;

        while (datas[j].score < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, left, j);

    if (i < right)
        qsort_descent_inplace(datas, i, right);
}